

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateSerializedSizeCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  Type TVar1;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  TVar1 = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
  this_00 = local_18;
  if (TVar1 == TYPE_MESSAGE) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "if ($has_property_check$) {\n  size += $tag_size$ + pb::CodedOutputStream.ComputeMessageSize($property_name$);\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_FieldGeneratorBase).variables_,local_28);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "if ($has_property_check$) {\n  size += $tag_size$ + pb::CodedOutputStream.ComputeGroupSize($property_name$);\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&(this->super_FieldGeneratorBase).variables_,local_38);
  }
  return;
}

Assistant:

void MessageFieldGenerator::GenerateSerializedSizeCode(io::Printer* printer) {
  if (descriptor_->type() == FieldDescriptor::Type::TYPE_MESSAGE) {
    printer->Print(
      variables_,
      "if ($has_property_check$) {\n"
      "  size += $tag_size$ + pb::CodedOutputStream.ComputeMessageSize($property_name$);\n"
      "}\n");
  } else {
    printer->Print(
      variables_,
      "if ($has_property_check$) {\n"
      "  size += $tag_size$ + pb::CodedOutputStream.ComputeGroupSize($property_name$);\n"
      "}\n");
  }
}